

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

void __thiscall IR::IndirOpnd::SetIndexOpnd(IndirOpnd *this,RegOpnd *indexOpnd)

{
  Opnd *this_00;
  RegOpnd *local_18;
  RegOpnd *indexOpnd_local;
  IndirOpnd *this_local;
  
  if (this->m_indexOpnd != (RegOpnd *)0x0) {
    Opnd::UnUse(&this->m_indexOpnd->super_Opnd);
  }
  local_18 = indexOpnd;
  if (indexOpnd != (RegOpnd *)0x0) {
    this_00 = Opnd::Use(&indexOpnd->super_Opnd,this->m_func);
    local_18 = Opnd::AsRegOpnd(this_00);
  }
  this->m_indexOpnd = local_18;
  return;
}

Assistant:

void
IndirOpnd::SetIndexOpnd(RegOpnd *indexOpnd)
{
    if (m_indexOpnd)
    {
        m_indexOpnd->UnUse();
    }
    if (indexOpnd)
    {
        indexOpnd = indexOpnd->Use(m_func)->AsRegOpnd();
    }

    m_indexOpnd = indexOpnd;
}